

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O0

void __thiscall errorString_conversionErrors_Test::TestBody(errorString_conversionErrors_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  uint64_t match_flags;
  char *message;
  char *in_R9;
  precise_unit pVar3;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  string local_40;
  undefined1 local_20 [8];
  precise_unit u1;
  errorString_conversionErrors_Test *this_local;
  
  u1._8_8_ = this;
  pPVar2 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam();
  std::__cxx11::string::string((string *)&local_40,(string *)pPVar2);
  match_flags = units::getDefaultFlags();
  pVar3 = units::unit_from_string(&local_40,match_flags);
  u1.multiplier_ = pVar3._8_8_;
  local_20 = (undefined1  [8])pVar3.multiplier_;
  std::__cxx11::string::~string((string *)&local_40);
  local_61 = units::is_error((precise_unit *)local_20);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_60,(AssertionResult *)"is_error(u1)","false","true",in_R9
              );
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0xa7,message);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

TEST_P(errorString, conversionErrors)
{
    auto u1 = unit_from_string(GetParam());
    EXPECT_TRUE(is_error(u1));
}